

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::SetId(Element *this,String *_id)

{
  allocator<char> local_39;
  String local_38;
  String *local_18;
  String *_id_local;
  Element *this_local;
  
  local_18 = _id;
  _id_local = (String *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"id",&local_39);
  SetAttribute<std::__cxx11::string>(this,&local_38,local_18);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void Element::SetId(const String& _id)
{
	SetAttribute("id", _id);
}